

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_array<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  pointer peVar1;
  pointer peVar2;
  element_type *peVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  error_info *v;
  pointer pbVar6;
  pointer pbVar7;
  pointer pbVar8;
  undefined8 uVar9;
  size_t sVar10;
  value_type *v_00;
  error_type *peVar11;
  error_type *peVar12;
  value_type *pvVar13;
  value_type *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  basic_value<toml::type_config> *pbVar16;
  size_t sVar17;
  _Alloc_hider _Var18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  array_format_info fmt;
  array_type val;
  source_location src;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  location first;
  ulong local_8d8;
  undefined1 local_8c8 [32];
  bool local_8a8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *local_8a0;
  long local_898;
  ulong local_890;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  local_888;
  vector<toml::error_info,_std::allocator<toml::error_info>_> *local_870;
  undefined **local_868;
  error_info local_860;
  undefined1 local_808 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  undefined8 local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_7a0 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_758;
  undefined1 local_738 [56];
  _Alloc_hider local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  undefined1 local_620 [16];
  undefined1 local_610 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8 [6];
  pointer local_570;
  pointer pbStack_568;
  pointer local_560;
  undefined1 local_558 [16];
  pointer local_548;
  array_type local_538;
  undefined1 local_518 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8 [4];
  undefined1 local_4b0 [32];
  bool local_490;
  location local_488;
  undefined1 local_440 [16];
  _Alloc_hider local_430;
  char local_420 [16];
  size_t local_410;
  size_t local_408;
  size_t sStack_400;
  size_t local_3f8;
  size_t local_3f0;
  size_t sStack_3e8;
  size_t local_3e0;
  source_location local_3d8;
  source_location local_358;
  source_location local_2d8;
  failure<toml::error_info> local_258;
  basic_value<toml::type_config> local_200;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  basic_value<toml::type_config> *v_01;
  
  peVar1 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  peVar2 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_start;
  location::location(&local_488,loc);
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar20 = loc->location_;
  lVar19 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  uVar15 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - lVar19;
  if ((uVar20 < uVar15) && (*(char *)(lVar19 + uVar20) == '[')) {
    if (uVar20 + 1 < uVar15) {
      if (*(char *)(lVar19 + uVar20) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar10 = 1;
      }
      else {
        sVar10 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar10;
      uVar15 = uVar20 + 1;
    }
    else if (uVar15 != uVar20) {
      sVar10 = loc->line_number_;
      sVar17 = loc->column_number_;
      do {
        if (*(char *)(lVar19 + uVar20) == '\n') {
          sVar10 = sVar10 + 1;
          loc->line_number_ = sVar10;
          sVar17 = 1;
        }
        else {
          sVar17 = sVar17 + 1;
        }
        loc->column_number_ = sVar17;
        uVar20 = uVar20 + 1;
      } while (uVar15 != uVar20);
    }
    loc->location_ = uVar15;
    local_888.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_888.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_888.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8a0 = __return_storage_ptr__;
    local_898 = (long)peVar1 - (long)peVar2;
    skip_multiline_spacer<toml::type_config>
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_8c8,loc,ctx,
               false);
    local_8d8 = 0x400000201;
    if ((local_8a8 & local_8c8[0]) != 0) {
      local_8d8 = 0x400000202;
    }
    local_870 = &ctx->errors_;
    bVar21 = true;
    local_868 = &PTR__scanner_base_00575798;
    local_890 = 0;
    while( true ) {
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar19 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - lVar19) <= loc->location_)
      break;
      if (*(char *)(lVar19 + loc->location_) == ']') {
        if (((local_8a8 == true) && ((bool)local_8c8[0] == true)) && (local_8c8[1] != none)) {
          local_8d8 = local_8d8 & 0xffffffffffff00ff | (ulong)(byte)local_8c8[1] << 8;
          local_890 = (ulong)(uint)local_8c8._4_4_;
        }
        break;
      }
      if (!bVar21) {
        region::region((region *)local_620,loc);
        source_location::source_location((source_location *)local_808,(region *)local_620);
        __return_storage_ptr__ = local_8a0;
        region::~region((region *)local_620);
        local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_680,
                   "toml::parse_array: expected value-separator `,` or closing `]`","");
        local_358.file_name_._M_dataplus._M_p = (pointer)&local_358.file_name_.field_2;
        local_358.last_offset_._0_4_ = local_808._48_4_;
        local_358.last_offset_._4_4_ = local_808._52_4_;
        local_358.length_._0_4_ = local_808._56_4_;
        local_358.length_._4_4_ = local_808._60_4_;
        local_358.last_line_ = local_808._32_8_;
        local_358.last_column_ = local_808._40_8_;
        local_358.first_column_ = local_808._16_8_;
        local_358.first_offset_ = local_808._24_8_;
        local_358.first_line_ = local_808._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_808._64_8_ == &local_7b8) {
          local_358.file_name_.field_2._8_8_ = local_7b8._8_8_;
        }
        else {
          local_358.file_name_._M_dataplus._M_p = (pointer)local_808._64_8_;
        }
        local_358.file_name_._M_string_length = local_808._72_8_;
        local_808._72_8_ = 0;
        local_7b8._M_local_buf[0] = '\0';
        local_358.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_7a8;
        local_358.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7a0[0]._0_8_;
        local_358.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7a0[0]._8_8_;
        _local_7a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )ZEXT816(0);
        aaStack_7a0[0]._8_8_ = (pointer)0x0;
        local_808._64_8_ = &local_7b8;
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"here","");
        make_error_info<>((error_info *)local_620,&local_680,&local_358,&local_6a0);
        err<toml::error_info>(&local_e0,(error_info *)local_620);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
        failure<toml::error_info>::~failure(&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._40_8_ != local_5d8) {
          operator_delete((void *)local_610._40_8_,local_5d8[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_610 + 0x10));
        if ((element_type *)local_620._0_8_ != (element_type *)local_610) {
          operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location(&local_358);
        _Var18._M_p = local_680._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) goto LAB_003d0356;
        goto LAB_003d035e;
      }
      if (((local_8a8 == true) && ((bool)local_8c8[0] == true)) && (local_8c8[1] != none)) {
        local_8d8 = (ulong)((uint)local_8d8 & 0xffff00ff) | (ulong)(byte)local_8c8[1] << 8 |
                    (ulong)(uint)local_8c8._4_4_ << 0x20;
      }
      parse_value<toml::type_config>
                ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_808,loc,ctx
                );
      if (local_808[0] == true) {
        v_00 = result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap
                         ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                          local_808,(source_location)0x576300);
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_620,v_00);
        pbVar8 = local_560;
        pbVar7 = pbStack_568;
        pbVar6 = local_570;
        if (local_8a8 == true) {
          local_570 = (pointer)local_8c8._8_8_;
          pbStack_568 = (pointer)local_8c8._16_8_;
          local_560 = (pointer)local_8c8._24_8_;
          local_518._16_8_ = pbVar8;
          local_518._8_8_ = pbVar7;
          local_518._0_8_ = pbVar6;
          local_8c8._8_8_ = (pointer)0x0;
          local_8c8._16_8_ = (pointer)0x0;
          local_8c8._24_8_ = (pointer)0x0;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_518);
        }
        skip_multiline_spacer<toml::type_config>
                  ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_518,loc,ctx
                   ,false);
        std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
        _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *
                       )local_8c8,
                       (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *
                       )local_518);
        if ((bool)local_4f8[0]._0_1_ == true) {
          local_4f8[0]._M_local_buf[0] = false;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_518 + 8));
        }
        if (local_8a8 == true) {
          uVar20 = 0xffffffffffffffff;
          lVar19 = 0;
          while (uVar20 = uVar20 + 1,
                uVar20 < (ulong)((long)(local_8c8._16_8_ - local_8c8._8_8_) >> 5)) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_570,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((_Alloc_hider *)local_8c8._8_8_)->_M_p + lVar19));
            lVar19 = lVar19 + 0x20;
            if (local_8a8 == false) {
              std::__throw_bad_optional_access();
            }
          }
          if ((bool)local_8c8[0] == true) {
            local_8d8 = local_8d8 & 0xffffffffffffff00 | 2;
          }
        }
        local_4b0._0_8_ = local_868;
        local_4b0[8] = 0x2c;
        character::scan((region *)local_518,(character *)local_4b0,loc);
        uVar9 = local_518._0_8_;
        bVar21 = local_518._0_8_ != 0;
        region::~region((region *)local_518);
        parse_comment_line<toml::type_config>
                  ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    *)local_518,loc,ctx);
        if ((bool)local_518[0] == false) {
          peVar12 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                  *)local_518,(source_location)0x576318);
          local_738._0_8_ = local_738 + 0x10;
          pcVar4 = (peVar12->title_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_738,pcVar4,pcVar4 + (peVar12->title_)._M_string_length);
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_738 + 0x20),&peVar12->locations_);
          local_700._M_p = (pointer)&local_6f0;
          pcVar4 = (peVar12->suffix_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_700,pcVar4,pcVar4 + (peVar12->suffix_)._M_string_length);
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(local_870,(error_info *)local_738);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_p != &local_6f0) {
            operator_delete(local_700._M_p,local_6f0._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_738 + 0x20));
          if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
            operator_delete((void *)local_738._0_8_,local_738._16_8_ + 1);
          }
        }
        if ((bool)local_518[0] == true) {
          pvVar13 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                              *)local_518,(source_location)0x576330);
          bVar22 = (pvVar13->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_engaged;
        }
        else {
          bVar22 = false;
        }
        if (bVar22 != false) {
          __x = (value_type *)
                result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                          *)local_518,(source_location)0x576348);
          if (*(char *)&__x[1]._M_dataplus._M_p == '\0') {
            std::__throw_bad_optional_access();
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_570,__x);
          local_8d8 = local_8d8 & 0xffffffffffffff00 | 2;
        }
        if (uVar9 != 0) {
          skip_multiline_spacer<toml::type_config>
                    ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_4b0,loc,
                     ctx,bVar22);
          std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
          _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                          *)local_8c8,
                         (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                          *)local_4b0);
          if (local_490 == true) {
            local_490 = false;
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_4b0 + 8));
          }
          if ((local_8a8 == true) && ((bool)local_8c8[0] == true)) {
            local_8d8 = local_8d8 & 0xffffffffffffff00 | 2;
          }
        }
        pbVar16 = (basic_value<toml::type_config> *)local_620;
        std::
        vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
        ::emplace_back<toml::basic_value<toml::type_config>>
                  ((vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
                    *)&local_888,pbVar16);
        result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
        ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   *)local_518,(EVP_PKEY_CTX *)pbVar16);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_620,(EVP_PKEY_CTX *)pbVar16);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_570);
        region::~region((region *)local_5d8);
        bVar22 = true;
      }
      else {
        peVar11 = result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap_err
                            ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                             local_808,(source_location)0x576360);
        local_860.title_._M_dataplus._M_p = (pointer)&local_860.title_.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(peVar11->title_)._M_dataplus._M_p;
        paVar5 = &(peVar11->title_).field_2;
        if (paVar14 == paVar5) {
          local_860.title_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_860.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar11->title_).field_2 + 8);
        }
        else {
          local_860.title_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_860.title_._M_dataplus._M_p = (pointer)paVar14;
        }
        local_860.title_._M_string_length = (peVar11->title_)._M_string_length;
        (peVar11->title_)._M_dataplus._M_p = (pointer)paVar5;
        (peVar11->title_)._M_string_length = 0;
        (peVar11->title_).field_2._M_local_buf[0] = '\0';
        local_860.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (peVar11->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_860.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (peVar11->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_860.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (peVar11->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_890 = 0;
        (peVar11->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (peVar11->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (peVar11->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_860.suffix_._M_dataplus._M_p = (pointer)&local_860.suffix_.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(peVar11->suffix_)._M_dataplus._M_p;
        paVar14 = &(peVar11->suffix_).field_2;
        if (paVar5 == paVar14) {
          local_860.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_860.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(peVar11->suffix_).field_2 + 8);
        }
        else {
          local_860.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_860.suffix_._M_dataplus._M_p = (pointer)paVar5;
        }
        local_860.suffix_._M_string_length = (peVar11->suffix_)._M_string_length;
        (peVar11->suffix_)._M_dataplus._M_p = (pointer)paVar14;
        (peVar11->suffix_)._M_string_length = 0;
        (peVar11->suffix_).field_2._M_local_buf[0] = '\0';
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(local_870,&local_860);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860.suffix_._M_dataplus._M_p != &local_860.suffix_.field_2) {
          operator_delete(local_860.suffix_._M_dataplus._M_p,
                          local_860.suffix_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_860.locations_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860.title_._M_dataplus._M_p != &local_860.title_.field_2) {
          operator_delete(local_860.title_._M_dataplus._M_p,
                          local_860.title_.field_2._M_allocated_capacity + 1);
        }
        sVar10 = loc->location_;
        pbVar16 = (basic_value<toml::type_config> *)ctx;
        skip_value<toml::type_config>(loc,ctx);
        bVar22 = sVar10 != loc->location_;
      }
      result<toml::basic_value<toml::type_config>,_toml::error_info>::cleanup
                ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_808,
                 (EVP_PKEY_CTX *)pbVar16);
      if (!bVar22) break;
    }
    __return_storage_ptr__ = local_8a0;
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar20 = loc->location_;
    v = (error_info *)
        (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
    uVar15 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)v;
    if ((uVar20 < uVar15) && (*(char *)((long)&(v->title_)._M_dataplus._M_p + uVar20) == ']')) {
      if (uVar20 + 1 < uVar15) {
        if (*(char *)((long)&(v->title_)._M_dataplus._M_p + uVar20) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar10 = 1;
        }
        else {
          sVar10 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar10;
        uVar15 = uVar20 + 1;
      }
      else if (uVar15 != uVar20) {
        sVar10 = loc->line_number_;
        sVar17 = loc->column_number_;
        do {
          if (*(char *)((long)&(v->title_)._M_dataplus._M_p + uVar20) == '\n') {
            sVar10 = sVar10 + 1;
            loc->line_number_ = sVar10;
            sVar17 = 1;
          }
          else {
            sVar17 = sVar17 + 1;
          }
          loc->column_number_ = sVar17;
          uVar20 = uVar20 + 1;
        } while (uVar15 != uVar20);
      }
      loc->location_ = uVar15;
      peVar1 = (ctx->errors_).
               super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_898 ==
          (long)peVar1 -
          (long)(ctx->errors_).
                super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                super__Vector_impl_data._M_start) {
        local_538.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_888.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_538.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_888.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_538.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_888.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_888.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_888.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_888.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_558 = (undefined1  [16])0x0;
        local_548 = (pointer)0x0;
        local_440._0_8_ =
             local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_440._8_8_ =
             local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_488.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_488.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_488.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_430._M_p = local_420;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_430,local_488.source_name_._M_dataplus._M_p,
                   local_488.source_name_._M_dataplus._M_p + local_488.source_name_._M_string_length
                  );
        local_408 = local_488.location_;
        sStack_400 = local_488.line_number_;
        local_3f8 = local_488.column_number_;
        local_3f0 = loc->location_;
        sStack_3e8 = loc->line_number_;
        local_410 = local_3f0 - local_488.location_;
        local_3e0 = loc->column_number_;
        fmt.closing_indent = (int32_t)local_890;
        fmt.fmt = (undefined1)local_8d8;
        fmt.indent_type = local_8d8._1_1_;
        fmt._2_2_ = local_8d8._2_2_;
        fmt.body_indent = local_8d8._4_4_;
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_808,&local_538,fmt,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_558,(region_type *)local_440);
        ok<toml::basic_value<toml::type_config>>
                  ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_808,
                   v_01);
        __return_storage_ptr__->is_ok_ = true;
        pbVar16 = &local_200;
        basic_value<toml::type_config>::basic_value
                  (&(__return_storage_ptr__->field_1).succ_.value,&local_200);
        basic_value<toml::type_config>::cleanup(&local_200,(EVP_PKEY_CTX *)pbVar16);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_200.comments_);
        region::~region(&local_200.region_);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_808,(EVP_PKEY_CTX *)pbVar16);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_758);
        region::~region((region *)(local_808 + 0x48));
        region::~region((region *)local_440);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_558);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::~vector(&local_538);
      }
      else {
        err<toml::error_info_const&>(&local_258,(toml *)(peVar1 + -1),v);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_258)
        ;
        failure<toml::error_info>::~failure(&local_258);
      }
    }
    else {
      region::region((region *)local_620,loc);
      source_location::source_location((source_location *)local_808,(region *)local_620);
      region::~region((region *)local_620);
      local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6c0,"toml::parse_array: missing closing bracket `]`","");
      local_3d8.file_name_._M_dataplus._M_p = (pointer)&local_3d8.file_name_.field_2;
      local_3d8.last_offset_._0_4_ = local_808._48_4_;
      local_3d8.last_offset_._4_4_ = local_808._52_4_;
      local_3d8.length_._0_4_ = local_808._56_4_;
      local_3d8.length_._4_4_ = local_808._60_4_;
      local_3d8.last_line_ = local_808._32_8_;
      local_3d8.last_column_ = local_808._40_8_;
      local_3d8.first_column_ = local_808._16_8_;
      local_3d8.first_offset_ = local_808._24_8_;
      local_3d8.first_line_ = local_808._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._64_8_ == &local_7b8) {
        local_3d8.file_name_.field_2._8_8_ = local_7b8._8_8_;
      }
      else {
        local_3d8.file_name_._M_dataplus._M_p = (pointer)local_808._64_8_;
      }
      local_3d8.file_name_._M_string_length = local_808._72_8_;
      local_808._72_8_ = 0;
      local_7b8._M_local_buf[0] = '\0';
      local_3d8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_7a8;
      local_3d8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7a0[0]._0_8_;
      local_3d8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7a0[0]._8_8_;
      _local_7a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )0x0;
      aaStack_7a0[0]._8_8_ = (pointer)0x0;
      local_808._64_8_ = &local_7b8;
      local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6e0,"expected `]`, reached EOF","");
      make_error_info<>((error_info *)local_620,&local_6c0,&local_3d8,&local_6e0);
      err<toml::error_info>(&local_138,(error_info *)local_620);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._40_8_ != local_5d8) {
        operator_delete((void *)local_610._40_8_,local_5d8[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_610 + 0x10));
      if ((element_type *)local_620._0_8_ != (element_type *)local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_3d8);
      local_680.field_2._M_allocated_capacity = local_6c0.field_2._M_allocated_capacity;
      _Var18._M_p = local_6c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
LAB_003d0356:
        operator_delete(_Var18._M_p,local_680.field_2._M_allocated_capacity + 1);
      }
LAB_003d035e:
      source_location::~source_location((source_location *)local_808);
    }
    if (local_8a8 == true) {
      local_8a8 = false;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_8c8 + 8));
    }
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::~vector(&local_888);
  }
  else {
    region::region((region *)local_620,loc);
    source_location::source_location((source_location *)local_808,(region *)local_620);
    region::~region((region *)local_620);
    local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_640,"toml::parse_array: The next token is not an array","");
    local_2d8.file_name_._M_dataplus._M_p = (pointer)&local_2d8.file_name_.field_2;
    local_2d8.last_offset_._0_4_ = local_808._48_4_;
    local_2d8.last_offset_._4_4_ = local_808._52_4_;
    local_2d8.length_._0_4_ = local_808._56_4_;
    local_2d8.length_._4_4_ = local_808._60_4_;
    local_2d8.last_line_ = local_808._32_8_;
    local_2d8.last_column_ = local_808._40_8_;
    local_2d8.first_column_ = local_808._16_8_;
    local_2d8.first_offset_ = local_808._24_8_;
    local_2d8.first_line_ = local_808._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._64_8_ == &local_7b8) {
      local_2d8.file_name_.field_2._8_8_ = local_7b8._8_8_;
    }
    else {
      local_2d8.file_name_._M_dataplus._M_p = (pointer)local_808._64_8_;
    }
    local_2d8.file_name_._M_string_length = local_808._72_8_;
    local_808._72_8_ = 0;
    local_7b8._M_local_buf[0] = '\0';
    local_2d8.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_7a8;
    local_2d8.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7a0[0]._0_8_;
    local_2d8.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7a0[0]._8_8_;
    _local_7a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
    aaStack_7a0[0]._8_8_ = (pointer)0x0;
    local_808._64_8_ = &local_7b8;
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"here","");
    make_error_info<>((error_info *)local_620,&local_640,&local_2d8,&local_660);
    err<toml::error_info>(&local_88,(error_info *)local_620);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._40_8_ != local_5d8) {
      operator_delete((void *)local_610._40_8_,local_5d8[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_610 + 0x10));
    if ((element_type *)local_620._0_8_ != (element_type *)local_610) {
      operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_808);
  }
  location::~location(&local_488);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_array(location& loc, context<TC>& ctx)
{
    const auto num_errors = ctx.errors().size();

    const auto first = loc;

    if(loc.eof() || loc.current() != '[')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: "
                "The next token is not an array", std::move(src), "here"));
    }
    loc.advance();

    typename basic_value<TC>::array_type val;

    array_format_info fmt;
    fmt.fmt = array_format::oneline;
    fmt.indent_type = indent_char::none;

    auto spacer = skip_multiline_spacer(loc, ctx);
    if(spacer.has_value() && spacer.value().newline_found)
    {
        fmt.fmt = array_format::multiline;
    }

    bool comma_found = true;
    while( ! loc.eof())
    {
        if(loc.current() == location::char_type(']'))
        {
            if(spacer.has_value() && spacer.value().newline_found &&
                spacer.value().indent_type != indent_char::none)
            {
                fmt.indent_type    = spacer.value().indent_type;
                fmt.closing_indent = spacer.value().indent;
            }
            break;
        }

        if( ! comma_found)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_array: "
                    "expected value-separator `,` or closing `]`",
                    std::move(src), "here"));
        }

        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        if(auto elem_res = parse_value(loc, ctx))
        {
            auto elem = std::move(elem_res.unwrap());

            if(spacer.has_value()) // copy previous comments to value
            {
                elem.comments() = std::move(spacer.value().comments);
            }

            // parse spaces between a value and a comma
            // array = [
            //     42    , # the answer
            //       ^^^^
            //     3.14 # pi
            //   , 2.71 ^^^^
            // ^^
            spacer = skip_multiline_spacer(loc, ctx);
            if(spacer.has_value())
            {
                for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                {
                    elem.comments().push_back(std::move(spacer.value().comments.at(i)));
                }
                if(spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }

            comma_found = character(',').scan(loc).is_ok();

            // parse comment after a comma
            // array = [
            //     42    , # the answer
            //             ^^^^^^^^^^^^
            //     3.14 # pi
            //          ^^^^
            // ]
            auto com_res = parse_comment_line(loc, ctx);
            if(com_res.is_err())
            {
                ctx.report_error(com_res.unwrap_err());
            }

            const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
            if(comment_found)
            {
                fmt.fmt = array_format::multiline;
                elem.comments().push_back(com_res.unwrap().value());
            }
            if(comma_found)
            {
                spacer = skip_multiline_spacer(loc, ctx, comment_found);
                if(spacer.has_value() && spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }
            val.push_back(std::move(elem));
        }
        else
        {
            // if err, push error to ctx and try recovery.
            ctx.report_error(std::move(elem_res.unwrap_err()));

            // if it looks like some value, then skip the value.
            // otherwise, it may be a new key-value pair or a new table and
            // the error is "missing closing ]". stop parsing.

            const auto before_skip = loc.get_location();
            skip_value(loc, ctx);
            if(before_skip == loc.get_location()) // cannot skip! break...
            {
                break;
            }
        }
    }

    if(loc.current() != ']')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: missing closing bracket `]`",
            std::move(src), "expected `]`, reached EOF"));
    }
    else
    {
        loc.advance();
    }
    // any error reported from this function
    if(num_errors != ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.errors().back());
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, region(first, loc)
        ));
}